

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int untrap(boolean force)

{
  xchar *pxVar1;
  undefined1 *puVar2;
  monst *pmVar3;
  permonst *pm;
  bool bVar4;
  boolean bVar5;
  byte bVar6;
  char cVar7;
  schar sVar8;
  xchar xVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  undefined8 in_RAX;
  undefined7 extraout_var;
  trap *ptVar14;
  obj *poVar15;
  uint uVar16;
  undefined8 in_RDX;
  vptrs *pvVar17;
  char *pcVar18;
  undefined7 in_register_00000039;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  int x;
  long lVar22;
  bool bVar23;
  bool bVar24;
  schar dy;
  schar dx;
  undefined4 local_2d4;
  trap *local_2d0;
  undefined8 local_2c8;
  schar dz;
  char kbuf [256];
  char qbuf [128];
  char the_trap [256];
  
  local_2d4 = (undefined4)CONCAT71(in_register_00000039,force);
  uVar11 = local_2c8._4_4_;
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,(int)CONCAT71((int7)((ulong)in_RAX >> 8),1));
  if ((((u.uprops[0x1c].intrinsic == 0) &&
       (local_2c8 = (char *)((ulong)local_2c8._4_4_ << 0x20), u.uprops[0x23].intrinsic != 0)) &&
      (u.uprops[0x24].extrinsic == 0)) &&
     (local_2c8 = (char *)CONCAT44(uVar11,(int)CONCAT71((int7)((ulong)in_RDX >> 8),1)),
     u.umonnum != u.umonster)) {
    bVar5 = dmgtype(youmonst.data,0x24);
    local_2c8 = (char *)CONCAT44(local_2c8._4_4_,(int)CONCAT71(extraout_var,bVar5 == '\0'));
  }
  iVar10 = getdir((char *)0x0,&dx,&dy,&dz);
  if (iVar10 == 0) {
    return 0;
  }
  lVar22 = (long)u.ux + (long)dx;
  lVar21 = (long)u.uy + (long)dy;
  bVar23 = false;
  iVar10 = 0;
  pvVar17 = (vptrs *)(level->objects[lVar22] + lVar21);
  while (poVar15 = pvVar17->v_nexthere, poVar15 != (obj *)0x0) {
    bVar24 = bVar23;
    if ((poVar15->otyp & 0xfffeU) == 0xda) {
      if (dy == '\0' && dx == '\0') {
LAB_00259129:
        bVar23 = true;
        bVar4 = iVar10 != 0;
        iVar10 = 1;
        bVar24 = true;
        if (bVar4) {
          iVar10 = 2;
          break;
        }
      }
    }
    else if ((poVar15->otyp == 0xdc && dx == '\0') && dy == '\0') goto LAB_00259129;
    bVar23 = bVar24;
    pvVar17 = &poVar15->v;
  }
  x = (int)lVar22;
  iVar12 = (int)lVar21;
  ptVar14 = t_at(level,x,iVar12);
  if ((ptVar14 != (trap *)0x0) && ((ptVar14->field_0x8 & 0x20) != 0)) {
    local_2d0 = ptVar14;
    pcVar18 = the(defexplain[(ulong)((byte)ptVar14->field_0x8 & 0x1f) + 0x2f]);
    strcpy(the_trap,pcVar18);
    ptVar14 = local_2d0;
    if (bVar23) {
      uVar11 = (byte)local_2d0->field_0x8 & 0x1f;
      if ((byte)((char)uVar11 - 0xbU) < 2) {
        pcVar18 = " that you\'re stuck in";
        if (u.utrap == 0) {
          pcVar18 = " while standing on the edge of it";
        }
        pline("You can\'t do much about %s%s.",the_trap,pcVar18);
      }
      else {
        pcVar18 = "are containers";
        if (iVar10 == 1) {
          pcVar18 = "is a container";
        }
        pcVar19 = an(defexplain[(ulong)uVar11 + 0x2f]);
        pcVar20 = "Disarm";
        if ((ptVar14->field_0x8 & 0x1f) == 0x13) {
          pcVar20 = "Remove";
        }
        sprintf(qbuf,"There %s and %s here. %s %s?",pcVar18,pcVar19,pcVar20,the_trap);
        cVar7 = yn_function(qbuf,"ynq",'q');
        if (cVar7 != 'n') {
          if (cVar7 == 'q') {
            return 0;
          }
          goto LAB_00259584;
        }
      }
      bVar23 = true;
      goto LAB_002591b6;
    }
LAB_00259584:
    ptVar14 = local_2d0;
    if (u.utrap != 0) {
      pcVar18 = "";
      if (u.uy == iVar12 && u.ux == x) {
        pcVar18 = " in it";
      }
      pline("You cannot deal with %s while trapped%s!",the_trap,pcVar18);
      return 1;
    }
    bVar6 = local_2d0->field_0x8 & 0x1f;
    switch(bVar6) {
    case 1:
      iVar10 = 1;
      break;
    case 2:
      iVar10 = 7;
      break;
    case 4:
      poVar15 = getobj("\x14\x06\b","untrap with",(obj **)0x0);
      if (poVar15 == (obj *)0x0) {
        return 0;
      }
      bVar23 = true;
      if ((*(uint *)&poVar15->field_0x4a & 1) == 0) {
        if ((*(uint *)&poVar15->field_0x4a >> 0x13 & 1) == 0 && poVar15->otyp == 0x142) {
          bVar23 = false;
        }
        else {
          bVar23 = true;
          if (poVar15->otyp == 0xf5) {
            bVar23 = poVar15->spe == '\0';
          }
        }
      }
      uVar11 = try_disarm(local_2d0,bVar23,dx,dy);
      if (1 < uVar11) {
        if (poVar15->otyp == 0xf5) {
          consume_obj_charge(poVar15,'\x01');
        }
        else {
          useup(poVar15);
          discover_object(0x142,'\x01','\x01');
        }
        pline("You repair the squeaky board.");
        deltrap(level,local_2d0);
        newsym((int)u.ux + (int)dx,(int)u.uy + (int)dy);
        more_experienced(1,1,5);
        newexplevel();
        return 1;
      }
      return uVar11;
    case 5:
    case 0x13:
      uVar11 = try_disarm(local_2d0,'\0',dx,dy);
      if (1 < uVar11) {
        pmVar3 = level->monsters[ptVar14->tx][ptVar14->ty];
        if ((pmVar3 == (monst *)0x0) || ((*(uint *)&pmVar3->field_0x60 >> 9 & 1) != 0)) {
          if ((ptVar14->field_0x8 & 0x1f) == 5) {
            pline("You disarm %s bear trap.",the_your[(byte)ptVar14->field_0x8 >> 7]);
            cnv_trap_obj(0xf9,1,ptVar14);
          }
          else {
            pline("You succeed in removing %s web.",the_your[(byte)ptVar14->field_0x8 >> 7]);
            deltrap(level,ptVar14);
          }
        }
        else {
          *(uint *)&pmVar3->field_0x60 = *(uint *)&pmVar3->field_0x60 & 0xff7ffdff;
          local_2c8 = the_your[(byte)ptVar14->field_0x8 >> 7];
          pcVar18 = "webbing";
          if ((ptVar14->field_0x8 & 0x1f) == 5) {
            pcVar18 = "bear trap";
          }
          pcVar19 = mon_nam(pmVar3);
          pline("You remove %s %s from %s.",local_2c8,pcVar18,pcVar19);
          reward_untrap(ptVar14,pmVar3);
        }
        newsym((int)u.ux + (int)dx,(int)u.uy + (int)dy);
        return 1;
      }
      return uVar11;
    case 6:
      uVar11 = try_disarm(local_2d0,'\0',dx,dy);
      if (1 < uVar11) {
        pline("You disarm %s land mine.",the_your[(byte)ptVar14->field_0x8 >> 7]);
        cnv_trap_obj(0xf8,1,ptVar14);
        return 1;
      }
      return uVar11;
    case 0xb:
    case 0xc:
      if (dy == '\0' && dx == '\0') {
        pcVar18 = "You are already on the edge of the pit.";
      }
      else {
        pmVar3 = level->monsters[lVar22][lVar21];
        if ((pmVar3 != (monst *)0x0) &&
           (uVar11 = *(uint *)&pmVar3->field_0x60, (uVar11 >> 9 & 1) == 0)) {
          bVar23 = true;
          if ((uVar11 & 0x100) == 0 && pmVar3->data == mons + 0xdb) {
            bVar23 = pmVar3->mhp < 7;
          }
          if ((uVar11 >> 0x17 & 1) == 0) {
            pcVar18 = Monnam(pmVar3);
            pcVar19 = "%s isn\'t trapped.";
            goto LAB_0025987f;
          }
          bVar5 = check_capacity((char *)0x0);
          if (bVar5 != '\0') {
            return 1;
          }
          iVar10 = untrap_prob(local_2d0);
          if (((char)iVar10 != '\0') && ((*(uint *)&pmVar3->field_0x60 & 0xc0000) == 0x40000)) {
            pcVar18 = body_part(0);
            pcVar18 = makeplural(pcVar18);
            pcVar19 = mon_nam(pmVar3);
            pline("You try to reach out your %s, but %s backs away skeptically.",pcVar18,pcVar19);
            return 1;
          }
          pm = pmVar3->data;
          if ((((pm == mons + 0xc) || (pm == mons + 0xb)) && (uarmg == (obj *)0x0)) &&
             ((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)))) {
            pcVar18 = mons_mname(pm);
            pcVar19 = body_part(6);
            pcVar19 = makeplural(pcVar19);
            pline("You grab the trapped %s using your bare %s.",pcVar18,pcVar19);
            bVar5 = poly_when_stoned(youmonst.data);
            if ((bVar5 == '\0') || (iVar12 = polymon(0x108), iVar12 == 0)) {
              pcVar18 = mons_mname(pmVar3->data);
              pcVar18 = an(pcVar18);
              sprintf(kbuf,"trying to help %s out of a pit",pcVar18);
              delayed_petrify((char *)0x0,kbuf);
              pline("You pull back!");
              return 1;
            }
            (*windowprocs.win_pause)(P_MESSAGE);
          }
          if ((char)iVar10 != '\0') {
            if ((bVar23) ||
               ((uarmg != (obj *)0x0 &&
                (((objects[uarmg->otyp].oc_oprop == '\x04' ||
                  (bVar5 = obj_resists(uarmg,5,0x32), bVar5 != '\0')) ||
                 (bVar5 = is_quest_artifact(uarmg), bVar5 != '\0')))))) {
              pcVar18 = mon_nam(pmVar3);
              pline("You try to grab %s, but cannot get a firm grasp.",pcVar18);
            }
            else {
              pcVar18 = mons_mname(pmVar3->data);
              pcVar18 = an(pcVar18);
              sprintf(kbuf,"trying to help %s out of a pit",pcVar18);
              mon_nam(pmVar3);
              pline("You try to grab %s, but...");
              if (uarmg == (obj *)0x0) {
                iVar10 = instadisintegrate(kbuf);
                if (iVar10 == 0) {
                  pline("You cannot get a firm grasp.");
                }
              }
              else {
                destroy_arm(uarmg,'\0');
              }
            }
            if ((*(uint *)&pmVar3->field_0x60 >> 0x13 & 1) != 0) {
              *(uint *)&pmVar3->field_0x60 = *(uint *)&pmVar3->field_0x60 & 0xfff7ffff;
              pcVar18 = Monnam(pmVar3);
              pline("%s awakens.",pcVar18);
              return 1;
            }
            return 1;
          }
          pcVar18 = body_part(0);
          pcVar18 = makeplural(pcVar18);
          pcVar19 = mon_nam(pmVar3);
          pline("You reach out your %s and grab %s.",pcVar18,pcVar19);
          bVar24 = true;
          if (!bVar23) {
            pcVar18 = mons_mname(pmVar3->data);
            pcVar18 = an(pcVar18);
            sprintf(kbuf,"trying to help %s out of a pit",pcVar18);
            if (uarmg != (obj *)0x0) {
              bVar24 = true;
              if (((objects[uarmg->otyp].oc_oprop == '\x04') ||
                  (bVar5 = obj_resists(uarmg,5,0x32), bVar5 != '\0')) ||
                 (bVar5 = is_quest_artifact(uarmg), bVar5 != '\0')) goto LAB_00259f8a;
              destroy_arm(uarmg,'\0');
            }
            iVar10 = instadisintegrate(kbuf);
            bVar24 = iVar10 == 0;
          }
LAB_00259f8a:
          if ((*(uint *)&pmVar3->field_0x60 >> 0x13 & 1) == 0) {
            if ((pmVar3->mfrozen == 0) || (iVar10 = rn2((uint)pmVar3->mfrozen), iVar10 != 0))
            goto LAB_00259fe3;
            pmVar3->field_0x62 = pmVar3->field_0x62 | 4;
            pmVar3->mfrozen = '\0';
            pcVar18 = "%s stirs.";
          }
          else {
            *(uint *)&pmVar3->field_0x60 = *(uint *)&pmVar3->field_0x60 & 0xfff7ffff;
            pcVar18 = "%s awakens.";
          }
          pcVar19 = Monnam(pmVar3);
          pline(pcVar18,pcVar19);
LAB_00259fe3:
          if (!bVar24) {
            return 1;
          }
          iVar10 = inv_weight();
          iVar10 = (uint)pmVar3->data->cwt + iVar10;
          iVar12 = try_lift(pmVar3,local_2d0,iVar10,'\0');
          if (iVar12 != 0) {
            poVar15 = (obj *)&pmVar3->minvent;
            while (poVar15 = poVar15->nobj, poVar15 != (obj *)0x0) {
              iVar10 = iVar10 + poVar15->owt;
            }
            iVar10 = try_lift(pmVar3,local_2d0,iVar10,'\x01');
            if (iVar10 != 0) {
              pcVar18 = mon_nam(pmVar3);
              pline("You pull %s out of the pit.",pcVar18);
              pmVar3->field_0x62 = pmVar3->field_0x62 & 0x7f;
              fill_pit(level,(int)pmVar3->mx,(int)pmVar3->my);
              reward_untrap(local_2d0,pmVar3);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        pcVar18 = "Try filling the pit instead.";
      }
      goto LAB_0025971b;
    default:
      if (bVar6 == 0x18) {
        iVar10 = 8;
        break;
      }
    case 3:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      pcVar18 = "this";
      if (dy != '\0' || dx != '\0') {
        pcVar18 = "that";
      }
      pcVar19 = "You cannot disable %s trap.";
LAB_0025987f:
      pline(pcVar19,pcVar18);
      return 0;
    }
    iVar10 = disarm_shooting_trap(local_2d0,iVar10,dx,dy);
    return iVar10;
  }
  bVar23 = false;
LAB_002591b6:
  if (dx == '\0' && dy == '\0') {
    local_2d0 = (trap *)CONCAT71(local_2d0._1_7_,(char)local_2c8 != '\0' && (char)local_2d4 == '\0')
    ;
    pvVar17 = (vptrs *)(level->objects[lVar22] + lVar21);
    while (pmVar3 = pvVar17->v_ocarry, pmVar3 != (monst *)0x0) {
      if ((ushort)(*(short *)((long)&pmVar3->m_id + 2) - 0xdaU) < 3) {
        pcVar18 = doname((obj *)pmVar3);
        pcVar19 = simple_typename((int)*(short *)((long)&pmVar3->m_id + 2));
        pcVar19 = an(pcVar19);
        pcVar18 = safe_qbuf("",0x24,pcVar18,pcVar19,"a box");
        sprintf(qbuf,"There is %s here. Check it for traps?",pcVar18);
        cVar7 = yn_function(qbuf,"ynq",'q');
        if (cVar7 != 'n') {
          if (cVar7 == 'q') {
            return 0;
          }
          if ((u.usteed == (monst *)0x0) || ('\x01' < u.weapon_skills[0x27].skill)) {
            if ((*(undefined1 *)((long)pmVar3->mtrack + 7) & 0x80) == 0) {
LAB_0025938a:
              if (((char)local_2d0 != '\0') && (uVar11 = mt_random(), uVar11 % 3 == 0)) {
LAB_002593ae:
                pcVar18 = xname((obj *)pmVar3);
                pcVar18 = the(pcVar18);
                pline("You find a trap on %s!",pcVar18);
                if ((char)local_2c8 == '\0') {
                  exercise(2,'\x01');
                }
                cVar7 = yn_function("Disarm it?","ynq",'q');
                bVar23 = true;
                if (cVar7 != 'n') {
                  if (cVar7 == 'q') {
                    return 1;
                  }
                  if ((pmVar3->mtrack[3].y & 0x80U) != 0) {
                    exercise(3,'\x01');
                    sVar8 = acurr(3);
                    iVar10 = sVar8 + u.ulevel;
                    bVar23 = urole.malenum == 0x164;
                    if ((char)local_2d4 == '\0') {
                      if ((((char)local_2c8 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                         (u.uprops[0x25].extrinsic == 0)) {
                        xVar9 = level_difficulty(&u.uz);
                        iVar12 = rnd(xVar9 / '\x02' + 0x4b);
                        if (iVar12 <= iVar10 << bVar23) goto LAB_00259825;
                      }
                      chest_trap((obj *)pmVar3,3,'\x01');
                      return 1;
                    }
LAB_00259825:
                    pline("You disarm it!");
                    pxVar1 = &pmVar3->mtrack[3].y;
                    *pxVar1 = *pxVar1 & 0x7f;
                    return 1;
                  }
                  pcVar18 = xname((obj *)pmVar3);
                  pcVar19 = "That %s was not trapped.";
                  goto LAB_002595fa;
                }
                goto LAB_002593fc;
              }
            }
            else {
              if ((char)local_2d4 != '\0') goto LAB_002593ae;
              if ((char)local_2c8 != '\0') goto LAB_0025938a;
              uVar11 = rn2(0x1f - u.ulevel);
              if (uVar11 < 10) goto LAB_002593ae;
            }
            pcVar18 = xname((obj *)pmVar3);
            pcVar18 = the(pcVar18);
            pcVar19 = "You find no traps on %s.";
LAB_002595fa:
            pline(pcVar19,pcVar18);
            return 1;
          }
          pcVar18 = mon_nam(u.usteed);
          pcVar19 = "You aren\'t skilled enough to reach from %s.";
          goto LAB_0025987f;
        }
      }
LAB_002593fc:
      pvVar17 = (vptrs *)&pmVar3->data;
    }
    pcVar18 = "You find no other traps here.";
    if (!bVar23) {
      pcVar18 = "You know of no traps here.";
    }
  }
  else {
    pmVar3 = level->monsters[lVar22][lVar21];
    if (((((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) &&
         ((pmVar3->m_ap_type == '\x01' &&
          ((pmVar3->mappearance == 0x1c || (pmVar3->mappearance == 0x1b)))))) &&
        (u.uprops[0x17].intrinsic == 0)) && (u.uprops[0x17].extrinsic == 0)) {
      stumble_onto_mimic(pmVar3,dx,dy);
      return 1;
    }
    if (level->locations[lVar22][lVar21].typ == '\x17') {
      uVar11 = *(uint *)&level->locations[lVar22][lVar21].field_0x6;
      uVar16 = uVar11 >> 4 & 0x1f;
      if (uVar16 == 2) {
        pcVar18 = "This door is safely open.";
      }
      else {
        if (uVar16 != 1) {
          if (uVar16 != 0) {
            if ((uVar11 >> 8 & 1) == 0) {
LAB_0025972f:
              if ((((char)local_2d4 != '\0') || ((char)local_2c8 == '\0')) ||
                 (uVar11 = mt_random(), uVar11 % 3 != 0)) {
LAB_0025974d:
                pline("You find no traps on the door.");
                return 1;
              }
            }
            else if ((char)local_2d4 == '\0') {
              if ((char)local_2c8 != '\0') goto LAB_0025972f;
              uVar11 = rn2(0x29 - u.ulevel);
              if (9 < uVar11) goto LAB_0025974d;
            }
            pline("You find a trap on the door!");
            iVar10 = 1;
            exercise(2,'\x01');
            cVar7 = yn_function("Disarm it?","ynq",'q');
            if (cVar7 != 'y') {
              return 1;
            }
            if ((level->locations[lVar22][lVar21].field_0x7 & 1) == 0) {
              pcVar18 = "This door was not trapped.";
              goto LAB_0025971d;
            }
            iVar10 = u.ulevel * 3;
            if (urole.malenum != 0x164) {
              iVar10 = u.ulevel;
            }
            exercise(3,'\x01');
            if ((char)local_2d4 == '\0') {
              if ((((char)local_2c8 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                 (u.uprops[0x25].extrinsic == 0)) {
                xVar9 = level_difficulty(&u.uz);
                iVar13 = rnd(xVar9 / '\x02' + 0x4b);
                if (iVar13 <= iVar10 + 0xf) goto LAB_00259a00;
              }
              pline("You set it off!");
              b_trapped("door",3);
              puVar2 = &level->locations[lVar22][lVar21].field_0x6;
              *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
              unblock_point(x,iVar12);
              newsym(x,iVar12);
              pcVar18 = in_rooms(level,(xchar)lVar22,(xchar)lVar21,0x12);
              if (*pcVar18 != '\0') {
                add_damage((xchar)lVar22,(xchar)lVar21,0);
              }
            }
            else {
LAB_00259a00:
              pline("You disarm it!");
              puVar2 = &level->locations[lVar22][lVar21].field_0x6;
              *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffeff;
            }
            return 1;
          }
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025927f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00259276;
            pcVar18 = "see";
          }
          else {
LAB_00259276:
            if (ublindf == (obj *)0x0) {
              pcVar18 = "feel";
            }
            else {
LAB_0025927f:
              pcVar18 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar18 = "see";
              }
            }
          }
          pcVar19 = "You %s no door there.";
          goto LAB_0025987f;
        }
        pcVar18 = "This door is broken.";
      }
    }
    else {
      ptVar14 = t_at(level,x,iVar12);
      if ((ptVar14 == (trap *)0x0) || ((ptVar14->field_0x8 & 0x20) == 0)) {
        pcVar18 = "You know of no traps there.";
      }
      else {
        pcVar18 = "You cannot disable that trap.";
      }
    }
  }
LAB_0025971b:
  iVar10 = 0;
LAB_0025971d:
  pline(pcVar18);
  return iVar10;
}

Assistant:

int untrap(boolean force)
{
	struct obj *otmp;
	boolean confused = (Confusion > 0 || Hallucination > 0);
	int x,y;
	int ch;
	struct trap *ttmp;
	struct monst *mtmp;
	boolean trap_skipped = FALSE;
	boolean box_here = FALSE;
	boolean deal_with_floor_trap = FALSE;
	char the_trap[BUFSZ], qbuf[QBUFSZ];
	int containercnt = 0;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	x = u.ux + dx;
	y = u.uy + dy;

	for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere) {
		if (Is_box(otmp) && !dx && !dy) {
			box_here = TRUE;
			containercnt++;
			if (containercnt > 1) break;
		}
	}

	if ((ttmp = t_at(level, x,y)) && ttmp->tseen) {
		deal_with_floor_trap = TRUE;
		strcpy(the_trap, the(trapexplain[ttmp->ttyp-1]));
		if (box_here) {
			if (ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT) {
			    pline("You can't do much about %s%s.",
					the_trap, u.utrap ?
					" that you're stuck in" :
					" while standing on the edge of it");
			    trap_skipped = TRUE;
			    deal_with_floor_trap = FALSE;
			} else {
			    sprintf(qbuf, "There %s and %s here. %s %s?",
				(containercnt == 1) ? "is a container" : "are containers",
				an(trapexplain[ttmp->ttyp-1]),
				ttmp->ttyp == WEB ? "Remove" : "Disarm", the_trap);
			    switch (ynq(qbuf)) {
				case 'q': return 0;
				case 'n': trap_skipped = TRUE;
					  deal_with_floor_trap = FALSE;
					  break;
			    }
			}
		}
		if (deal_with_floor_trap) {
		    if (u.utrap) {
			pline("You cannot deal with %s while trapped%s!", the_trap,
				(x == u.ux && y == u.uy) ? " in it" : "");
			return 1;
		    }
		    switch(ttmp->ttyp) {
			case BEAR_TRAP:
			case WEB:
				return disarm_holdingtrap(ttmp, dx, dy);
			case LANDMINE:
				return disarm_landmine(ttmp, dx, dy);
			case SQKY_BOARD:
				return disarm_squeaky_board(ttmp, dx, dy);
			case DART_TRAP:
				return disarm_shooting_trap(ttmp, DART, dx, dy);
			case SHURIKEN_TRAP:
				return disarm_shooting_trap(ttmp, SHURIKEN, dx, dy);
			case ARROW_TRAP:
				return disarm_shooting_trap(ttmp, ARROW, dx, dy);
			case PIT:
			case SPIKED_PIT:
				if (!dx && !dy) {
				    pline("You are already on the edge of the pit.");
				    return 0;
				}
				if (!(mtmp = m_at(level, x,y))) {
				    pline("Try filling the pit instead.");
				    return 0;
				}
				return help_monster_out(mtmp, ttmp);
			default:
				pline("You cannot disable %s trap.", (dx || dy) ? "that" : "this");
				return 0;
		    }
		}
	} /* end if */

	if (!dx && !dy) {
	    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    sprintf(qbuf, "There is %s here. Check it for traps?",
			safe_qbuf("", sizeof("There is  here. Check it for traps?"),
				doname(otmp), an(simple_typename(otmp->otyp)), "a box"));
		    switch (ynq(qbuf)) {
			case 'q': return 0;
			case 'n': continue;
		    }
		    if (u.usteed && P_SKILL(P_RIDING) < P_BASIC) {
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
			return 0;
		    }
		    if ((otmp->otrapped && (force || (!confused
				&& rn2(MAXULEV + 1 - u.ulevel) < 10)))
		       || (!force && confused && !rn2(3))) {
			pline("You find a trap on %s!", the(xname(otmp)));
			if (!confused) exercise(A_WIS, TRUE);

			switch (ynq("Disarm it?")) {
			    case 'q': return 1;
			    case 'n': trap_skipped = TRUE;  continue;
			}

			if (otmp->otrapped) {
			    exercise(A_DEX, TRUE);
			    ch = ACURR(A_DEX) + u.ulevel;
			    if (Role_if (PM_ROGUE)) ch *= 2;
			    if (!force && (confused || Fumbling ||
				rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
				chest_trap(otmp, FINGER, TRUE);
			    } else {
				pline("You disarm it!");
				otmp->otrapped = 0;
			    }
			} else pline("That %s was not trapped.", xname(otmp));
			return 1;
		    } else {
			pline("You find no traps on %s.", the(xname(otmp)));
			return 1;
		    }
		}

	    pline(trap_skipped ? "You find no other traps here."
			       : "You know of no traps here.");
	    return 0;
	}

	if ((mtmp = m_at(level, x,y))			&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	if (!IS_DOOR(level->locations[x][y].typ)) {
	    if ((ttmp = t_at(level, x,y)) && ttmp->tseen)
		pline("You cannot disable that trap.");
	    else
		pline("You know of no traps there.");
	    return 0;
	}

	switch (level->locations[x][y].doormask) {
	    case D_NODOOR:
		pline("You %s no door there.", Blind ? "feel" : "see");
		return 0;
	    case D_ISOPEN:
		pline("This door is safely open.");
		return 0;
	    case D_BROKEN:
		pline("This door is broken.");
		return 0;
	}

	if ((level->locations[x][y].doormask & D_TRAPPED
	     && (force ||
		 (!confused && rn2(MAXULEV - u.ulevel + 11) < 10)))
	    || (!force && confused && !rn2(3))) {
		pline("You find a trap on the door!");
		exercise(A_WIS, TRUE);
		if (ynq("Disarm it?") != 'y') return 1;
		if (level->locations[x][y].doormask & D_TRAPPED) {
		    ch = 15 + (Role_if (PM_ROGUE) ? u.ulevel*3 : u.ulevel);
		    exercise(A_DEX, TRUE);
		    if (!force && (confused || Fumbling ||
				     rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
			pline("You set it off!");
			b_trapped("door", FINGER);
			level->locations[x][y].doormask = D_NODOOR;
			unblock_point(x, y);
			newsym(x, y);
			/* (probably ought to charge for this damage...) */
			if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
		    } else {
			pline("You disarm it!");
			level->locations[x][y].doormask &= ~D_TRAPPED;
		    }
		} else pline("This door was not trapped.");
		return 1;
	} else {
		pline("You find no traps on the door.");
		return 1;
	}
}